

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_view_test.cpp
# Opt level: O3

void test_detached_view<cornelich::util::buffer_view>(buffer_view *view)

{
  ResultBuilder *pRVar1;
  ResultBuilder *pRVar2;
  ResultBuilder __catchResult;
  uint8_t *local_300;
  undefined1 local_2f8 [40];
  void *local_2d0;
  ResultBuilder local_2c8;
  
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_2f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
             ,0x1f);
  Catch::ResultBuilder::ResultBuilder
            (&local_2c8,"REQUIRE",(SourceLineInfo *)local_2f8,"view.data() == nullptr",Normal);
  pRVar2 = (ResultBuilder *)(local_2f8 + 0x10);
  if ((ResultBuilder *)local_2f8._0_8_ != pRVar2) {
    operator_delete((void *)local_2f8._0_8_);
  }
  local_300 = view->m_data;
  local_2d0 = (void *)0x0;
  local_2f8._0_8_ = &local_2c8;
  local_2f8._8_8_ = &local_300;
  pRVar1 = Catch::ExpressionLhs<unsigned_char*const&>::
           captureExpression<(Catch::Internal::Operator)0,decltype(nullptr)>
                     ((ExpressionLhs<unsigned_char*const&> *)local_2f8,&local_2d0);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&local_2c8);
  Catch::ResultBuilder::react(&local_2c8);
  Catch::ResultBuilder::~ResultBuilder(&local_2c8);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_2f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
             ,0x20);
  Catch::ResultBuilder::ResultBuilder
            (&local_2c8,"REQUIRE",(SourceLineInfo *)local_2f8,"view.limit() == 0",Normal);
  if ((ResultBuilder *)local_2f8._0_8_ != pRVar2) {
    operator_delete((void *)local_2f8._0_8_);
  }
  local_300 = (uint8_t *)CONCAT44(local_300._4_4_,view->m_limit);
  local_2d0 = (void *)((ulong)local_2d0 & 0xffffffff00000000);
  local_2f8._0_8_ = &local_2c8;
  local_2f8._8_8_ = &local_300;
  pRVar1 = Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<int_const&> *)local_2f8,(int *)&local_2d0);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&local_2c8);
  Catch::ResultBuilder::react(&local_2c8);
  Catch::ResultBuilder::~ResultBuilder(&local_2c8);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_2f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
             ,0x21);
  Catch::ResultBuilder::ResultBuilder
            (&local_2c8,"REQUIRE",(SourceLineInfo *)local_2f8,"view.position() == 0",Normal);
  if ((ResultBuilder *)local_2f8._0_8_ != pRVar2) {
    operator_delete((void *)local_2f8._0_8_);
  }
  local_2f8._8_8_ = &view->m_position;
  local_300 = (uint8_t *)((ulong)local_300 & 0xffffffff00000000);
  local_2f8._0_8_ = &local_2c8;
  pRVar1 = Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<int_const&> *)local_2f8,(int *)&local_300);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&local_2c8);
  Catch::ResultBuilder::react(&local_2c8);
  Catch::ResultBuilder::~ResultBuilder(&local_2c8);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_2f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
             ,0x22);
  Catch::ResultBuilder::ResultBuilder
            (&local_2c8,"REQUIRE",(SourceLineInfo *)local_2f8,"view.remaining() == 0",Normal);
  if ((ResultBuilder *)local_2f8._0_8_ != pRVar2) {
    operator_delete((void *)local_2f8._0_8_);
  }
  local_300 = (uint8_t *)CONCAT44(local_300._4_4_,view->m_limit - view->m_position);
  local_2d0 = (void *)((ulong)local_2d0 & 0xffffffff00000000);
  local_2f8._0_8_ = &local_2c8;
  local_2f8._8_8_ = &local_300;
  pRVar2 = Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<int_const&> *)local_2f8,(int *)&local_2d0);
  Catch::ResultBuilder::endExpression(pRVar2);
  Catch::ResultBuilder::shouldDebugBreak(&local_2c8);
  Catch::ResultBuilder::react(&local_2c8);
  Catch::ResultBuilder::~ResultBuilder(&local_2c8);
  return;
}

Assistant:

void test_detached_view(T & view)
{
    REQUIRE(view.data() == nullptr);
    REQUIRE(view.limit() == 0);
    REQUIRE(view.position() == 0);
    REQUIRE(view.remaining() == 0);
}